

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.hpp
# Opt level: O1

void __thiscall
MAFSA::stack<MAFSA::daciuk<28>::node_*>::push(stack<MAFSA::daciuk<28>::node_*> *this,node *l)

{
  ulong uVar1;
  node **__src;
  size_t sVar2;
  node **__dest;
  
  uVar1 = this->reserved;
  if (uVar1 <= this->current + 1) {
    __dest = (node **)operator_new__(-(ulong)((uVar1 & 0x7000000000000000) != 0) | uVar1 << 4);
    __src = this->buffer;
    memcpy(__dest,__src,uVar1 * 8);
    this->reserved = uVar1 * 2;
    if (__src != (node **)0x0) {
      operator_delete__(__src);
    }
    this->buffer = __dest;
  }
  sVar2 = this->current;
  this->current = sVar2 + 1;
  this->buffer[sVar2 + 1] = l;
  return;
}

Assistant:

void push(_DATA l)
    {
        if (current + 1 >= reserved)
        {
            _DATA *_t = new _DATA [2 * reserved];
            memcpy(_t, buffer, reserved * sizeof(_DATA));

            reserved *= 2;
            delete [] buffer;

            buffer = _t;
        }

        buffer[++current] = l;
    }